

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O2

JavascriptRegExp *
Js::JavascriptRegExp::ToRegExp(Var var,PCWSTR varName,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined8 in_RAX;
  JavascriptRegExp *pJVar6;
  undefined4 *puVar7;
  RecyclableObject *pRVar8;
  undefined4 extraout_var;
  undefined8 uStack_38;
  TypeId remoteTypeId;
  
  uStack_38 = in_RAX;
  bVar3 = VarIs<Js::JavascriptRegExp>(var);
  if ((bVar3) &&
     (pJVar6 = UnsafeVarTo<Js::JavascriptRegExp>(var), pJVar6 != (JavascriptRegExp *)0x0)) {
    return pJVar6;
  }
  if (var == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00bafe05;
    *puVar7 = 0;
  }
  bVar3 = TaggedInt::Is(var);
  if (((ulong)var >> 0x32 == 0) && (!bVar3)) {
    pRVar8 = UnsafeVarTo<Js::RecyclableObject>(var);
    if (pRVar8 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00bafe05;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar8->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_HostDispatch) {
        uStack_38 = CONCAT44(0x58,(undefined4)uStack_38);
        pRVar8 = UnsafeVarTo<Js::RecyclableObject>(var);
        iVar4 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x54])(pRVar8,(long)&uStack_38 + 4);
        if ((iVar4 != 0) && (uStack_38._4_4_ == 0x23)) {
          iVar4 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x56])(pRVar8);
          return (JavascriptRegExp *)CONCAT44(extraout_var,iVar4);
        }
      }
    }
    else {
      BVar5 = RecyclableObject::IsExternal(pRVar8);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00bafe05:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
    }
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec38,varName);
}

Assistant:

JavascriptRegExp* JavascriptRegExp::ToRegExp(Var var, PCWSTR varName, ScriptContext* scriptContext)
    {
        JavascriptRegExp * regExp = JavascriptOperators::TryFromVar<JavascriptRegExp>(var);
        if (regExp)
        {
            return regExp;
        }

        if (JavascriptOperators::GetTypeId(var) == TypeIds_HostDispatch)
        {
            TypeId remoteTypeId = TypeIds_Limit;
            RecyclableObject* reclObj = UnsafeVarTo<RecyclableObject>(var);
            if (reclObj->GetRemoteTypeId(&remoteTypeId) && remoteTypeId == TypeIds_RegEx)
            {
                return static_cast<JavascriptRegExp *>(reclObj->GetRemoteObject());
            }
        }

        JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedRegExp, varName);
    }